

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void bitmap_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  bool monochrome;
  Am_Style fs;
  Am_Style ls;
  int top;
  int left;
  Am_Image_Array local_28;
  Am_Image_Array image;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  image.data._0_4_ = y_offset;
  image.data._4_4_ = x_offset;
  pAVar5 = Am_Object::Get(self,0xb0,0);
  Am_Image_Array::Am_Image_Array(&local_28,pAVar5);
  bVar1 = Am_Image_Array::Valid(&local_28);
  if (bVar1) {
    pAVar5 = Am_Object::Get(self,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    uVar3 = iVar2 + image.data._4_4_;
    pAVar5 = Am_Object::Get(self,0x65,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    uVar4 = iVar2 + (int)image.data;
    pAVar5 = Am_Object::Get(self,0x6b,0);
    Am_Style::Am_Style(&fs,pAVar5);
    pAVar5 = Am_Object::Get(self,0x6a,0);
    Am_Style::Am_Style((Am_Style *)&stack0xffffffffffffffb0,pAVar5);
    pAVar5 = Am_Object::Get(self,0xb1,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    (*drawonable->_vptr_Am_Drawonable[0x27])
              (drawonable,(ulong)uVar3,(ulong)uVar4,0xffffffff,0xffffffff,&local_28,0,0,&fs,
               &stack0xffffffffffffffb0,bVar1,7);
    Am_Style::~Am_Style((Am_Style *)&stack0xffffffffffffffb0);
    Am_Style::~Am_Style(&fs);
  }
  Am_Image_Array::~Am_Image_Array(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, bitmap_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  Am_Image_Array image = self.Get(Am_IMAGE);
  if (image.Valid()) {
    int left = (int)self.Get(Am_LEFT) + x_offset;
    int top = (int)self.Get(Am_TOP) + y_offset;
    Am_Style ls = self.Get(Am_LINE_STYLE);
    Am_Style fs = self.Get(Am_FILL_STYLE);
    bool monochrome = self.Get(Am_DRAW_MONOCHROME);
    drawonable->Draw_Image(left, top, -1, -1, image, 0, 0, ls, fs, monochrome,
                           Am_DRAW_MASK_COPY);
  }
}